

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O3

bool embree::sse2::InstanceArrayIntersector1MB::occluded
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  Vec3ff *pVVar1;
  float *pfVar2;
  ulong uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  Geometry *pGVar7;
  RTCRayQueryContext *pRVar8;
  long *plVar9;
  long lVar10;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar11;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  undefined1 auVar22 [12];
  long lVar16;
  _func_int *p_Var17;
  float fVar18;
  float extraout_XMM0_Dc;
  undefined1 auVar19 [12];
  float extraout_XMM0_Db;
  undefined1 in_XMM0 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 in_XMM1 [16];
  vfloat4 a0;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float in_XMM2_Da;
  float in_XMM2_Db;
  float fVar27;
  float in_XMM2_Dc;
  float fVar28;
  float in_XMM2_Dd;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar29 [12];
  vfloat4 l02;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float in_XMM4_Da;
  float in_XMM4_Db;
  float in_XMM4_Dc;
  float in_XMM4_Dd;
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 in_XMM5 [16];
  float in_XMM6_Da;
  float fVar34;
  float in_XMM6_Db;
  float in_XMM6_Dc;
  float in_XMM6_Dd;
  float fVar35;
  float fVar36;
  undefined1 auVar37 [12];
  uint uVar38;
  float fVar39;
  undefined1 in_XMM7 [16];
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float in_XMM10_Da;
  float in_XMM10_Db;
  float in_XMM10_Dc;
  float in_XMM10_Dd;
  float in_XMM11_Da;
  float fVar47;
  float fVar48;
  float fVar49;
  float in_XMM11_Db;
  float in_XMM11_Dc;
  float in_XMM11_Dd;
  float in_XMM12_Da;
  float fVar50;
  float fVar51;
  float in_XMM12_Db;
  float in_XMM12_Dc;
  float in_XMM12_Dd;
  float in_XMM13_Da;
  float fVar52;
  float fVar53;
  float in_XMM13_Db;
  float in_XMM13_Dc;
  float in_XMM13_Dd;
  float in_XMM14_Da;
  float fVar54;
  float in_XMM14_Db;
  float in_XMM14_Dc;
  undefined1 auVar55 [16];
  float fVar56;
  float fVar57;
  RayQueryContext newcontext;
  undefined1 local_168 [8];
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  undefined1 local_128 [8];
  float fStack_120;
  float fStack_11c;
  float local_118;
  undefined4 uStack_114;
  undefined1 local_108 [8];
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float local_e8;
  
  auVar37 = in_XMM7._0_12_;
  a0.field_0._0_12_ = in_XMM1._0_12_;
  auVar19 = in_XMM0._0_12_;
  auVar32 = in_XMM5._0_12_;
  uVar13 = prim->primID_;
  pGVar7 = (context->scene->geometries).items[prim->instID_].ptr;
  p_Var17 = *(_func_int **)&pGVar7->field_0x58;
  if ((((p_Var17 == (_func_int *)0x0) &&
       ((uVar14 = (ulong)*(uint *)(*(long *)&pGVar7[1].time_range.upper +
                                  (long)pGVar7[1].intersectionFilterN * (ulong)uVar13),
        uVar14 == 0xffffffff ||
        (p_Var17 = pGVar7[1].super_RefCount._vptr_RefCount[uVar14], p_Var17 == (_func_int *)0x0))))
      || ((ray->mask & pGVar7->mask) == 0)) ||
     (pRVar8 = context->user, pRVar8->instID[0] != 0xffffffff)) {
    return false;
  }
  pRVar8->instID[0] = prim->instID_;
  pRVar8->instPrimID[0] = uVar13;
  uVar14 = (ulong)prim->primID_;
  if (pGVar7->numTimeSteps == 1) {
    plVar9 = *(long **)&pGVar7[1].fnumTimeSegments;
    iVar6 = (int)plVar9[4];
    if ((pGVar7->field_8).field_0x1 != '\x01') {
      if (iVar6 == 0x9134) {
        lVar10 = *plVar9;
        lVar16 = uVar14 * plVar9[2];
        in_XMM14_Db = *(float *)(lVar10 + 0x10 + lVar16);
        in_XMM14_Da = *(float *)(lVar10 + lVar16);
        in_XMM14_Dc = *(float *)(lVar10 + 0x20 + lVar16);
        a0.field_0._4_4_ = (float)*(undefined4 *)(lVar10 + 0x14 + lVar16);
        a0.field_0._0_4_ = (float)*(undefined4 *)(lVar10 + 4 + lVar16);
        a0.field_0._8_4_ = (float)*(undefined4 *)(lVar10 + 0x24 + lVar16);
        auVar19._4_4_ = (float)*(undefined4 *)(lVar10 + 0x18 + lVar16);
        auVar19._0_4_ = (float)*(undefined4 *)(lVar10 + 8 + lVar16);
        auVar19._8_4_ = (float)*(undefined4 *)(lVar10 + 0x28 + lVar16);
        auVar32._4_4_ = (float)*(undefined4 *)(lVar10 + 0x1c + lVar16);
        auVar32._0_4_ = (float)*(undefined4 *)(lVar10 + 0xc + lVar16);
        auVar32._8_4_ = (float)*(undefined4 *)(lVar10 + 0x2c + lVar16);
      }
      else if (iVar6 == 0x9234) {
        lVar10 = *plVar9;
        lVar16 = uVar14 * plVar9[2];
        uVar4 = *(undefined8 *)(lVar10 + 4 + lVar16);
        in_XMM14_Da = *(float *)(lVar10 + lVar16);
        in_XMM14_Db = (float)uVar4;
        in_XMM14_Dc = (float)((ulong)uVar4 >> 0x20);
        uVar4 = *(undefined8 *)(lVar10 + 0x10 + lVar16);
        a0.field_0._4_4_ = (float)(int)uVar4;
        a0.field_0._0_4_ = (float)*(undefined4 *)(lVar10 + 0xc + lVar16);
        a0.field_0._8_4_ = (float)(int)((ulong)uVar4 >> 0x20);
        uVar4 = *(undefined8 *)(lVar10 + 0x1c + lVar16);
        auVar19._4_4_ = (float)(int)uVar4;
        auVar19._0_4_ = (float)*(undefined4 *)(lVar10 + 0x18 + lVar16);
        auVar19._8_4_ = (float)(int)((ulong)uVar4 >> 0x20);
        uVar4 = *(undefined8 *)(lVar10 + 0x28 + lVar16);
        auVar32._4_4_ = (float)(int)uVar4;
        auVar32._0_4_ = (float)*(undefined4 *)(lVar10 + 0x24 + lVar16);
        auVar32._8_4_ = (float)(int)((ulong)uVar4 >> 0x20);
      }
      else if (iVar6 == 0xb001) {
        lVar10 = *plVar9;
        lVar16 = uVar14 * plVar9[2];
        uVar4 = *(undefined8 *)(lVar10 + 0x34 + lVar16);
        in_XMM14_Da = *(float *)(lVar10 + lVar16);
        auVar23._4_4_ = *(undefined4 *)(lVar10 + 4 + lVar16);
        auVar23._0_4_ = *(undefined4 *)(lVar10 + 0xc + lVar16);
        uVar5 = *(undefined8 *)(lVar10 + 0x1c + lVar16);
        fVar18 = *(float *)(lVar10 + 0x24 + lVar16);
        fVar47 = *(float *)(lVar10 + 0x28 + lVar16);
        fVar35 = *(float *)(lVar10 + 0x2c + lVar16);
        fVar40 = *(float *)(lVar10 + 0x30 + lVar16);
        fVar47 = fVar40 * fVar40 + fVar35 * fVar35 + fVar18 * fVar18 + fVar47 * fVar47;
        auVar21 = rsqrtss(ZEXT416((uint)fVar47),ZEXT416((uint)fVar47));
        fVar18 = auVar21._0_4_;
        auVar19._8_4_ = (float)*(undefined4 *)(lVar10 + 8 + lVar16);
        auVar19._0_8_ = *(undefined8 *)(lVar10 + 0x10 + lVar16);
        in_XMM14_Db = (float)uVar4;
        in_XMM14_Dc = (float)((ulong)uVar4 >> 0x20);
        auVar23._12_4_ = fVar35 * (fVar18 * fVar18 * fVar47 * -0.5 * fVar18 + fVar18 * 1.5);
        auVar23._8_4_ = *(undefined4 *)(lVar10 + 0x3c + lVar16);
        a0.field_0._0_12_ = auVar23._0_12_;
        auVar32._4_4_ = (float)(int)uVar5;
        auVar32._0_4_ = (float)*(undefined4 *)(lVar10 + 0x18 + lVar16);
        auVar32._8_4_ = (float)(int)((ulong)uVar5 >> 0x20);
      }
      else if (iVar6 == 0x9244) {
        lVar10 = *plVar9;
        lVar16 = uVar14 * plVar9[2];
        pfVar2 = (float *)(lVar10 + lVar16);
        in_XMM14_Da = *pfVar2;
        in_XMM14_Db = pfVar2[1];
        in_XMM14_Dc = pfVar2[2];
        a0.field_0._0_12_ = SUB1612(*(undefined1 (*) [16])(lVar10 + 0x10 + lVar16),0);
        auVar19 = SUB1612(*(undefined1 (*) [16])(lVar10 + 0x20 + lVar16),0);
        auVar32 = SUB1612(*(undefined1 (*) [16])(lVar10 + 0x30 + lVar16),0);
      }
      goto LAB_0018075e;
    }
    if (iVar6 == 0x9134) {
      lVar10 = *plVar9;
      lVar16 = uVar14 * plVar9[2];
      in_XMM13_Db = *(float *)(lVar10 + 0x10 + lVar16);
      in_XMM13_Da = *(float *)(lVar10 + lVar16);
      in_XMM2_Da = *(float *)(lVar10 + 4 + lVar16);
      in_XMM6_Da = *(float *)(lVar10 + 8 + lVar16);
      in_XMM4_Da = *(float *)(lVar10 + 0xc + lVar16);
      in_XMM13_Dc = *(float *)(lVar10 + 0x20 + lVar16);
      in_XMM13_Dd = 0.0;
      in_XMM2_Db = *(float *)(lVar10 + 0x14 + lVar16);
      in_XMM2_Dc = *(float *)(lVar10 + 0x24 + lVar16);
      in_XMM2_Dd = 0.0;
      in_XMM6_Db = *(float *)(lVar10 + 0x18 + lVar16);
      in_XMM6_Dc = *(float *)(lVar10 + 0x28 + lVar16);
      in_XMM6_Dd = 0.0;
      in_XMM4_Db = *(float *)(lVar10 + 0x1c + lVar16);
      in_XMM4_Dc = *(float *)(lVar10 + 0x2c + lVar16);
      in_XMM4_Dd = 0.0;
    }
    else if (iVar6 == 0x9234) {
      lVar10 = *plVar9;
      lVar16 = uVar14 * plVar9[2];
      uVar4 = *(undefined8 *)(lVar10 + 4 + lVar16);
      in_XMM13_Da = *(float *)(lVar10 + lVar16);
      in_XMM13_Db = (float)uVar4;
      in_XMM13_Dc = (float)((ulong)uVar4 >> 0x20);
      in_XMM13_Dd = 0.0;
      uVar4 = *(undefined8 *)(lVar10 + 0x10 + lVar16);
      in_XMM2_Da = *(float *)(lVar10 + 0xc + lVar16);
      in_XMM2_Db = (float)uVar4;
      in_XMM2_Dc = (float)((ulong)uVar4 >> 0x20);
      in_XMM2_Dd = 0.0;
      uVar4 = *(undefined8 *)(lVar10 + 0x1c + lVar16);
      in_XMM6_Da = *(float *)(lVar10 + 0x18 + lVar16);
      in_XMM6_Db = (float)uVar4;
      in_XMM6_Dc = (float)((ulong)uVar4 >> 0x20);
      in_XMM6_Dd = 0.0;
      uVar4 = *(undefined8 *)(lVar10 + 0x28 + lVar16);
      in_XMM4_Da = *(float *)(lVar10 + 0x24 + lVar16);
      in_XMM4_Db = (float)uVar4;
      in_XMM4_Dc = (float)((ulong)uVar4 >> 0x20);
      in_XMM4_Dd = 0.0;
    }
    else if (iVar6 == 0xb001) {
      lVar10 = *plVar9;
      lVar16 = uVar14 * plVar9[2];
      pfVar2 = (float *)(lVar10 + 0x10 + lVar16);
      in_XMM6_Da = *pfVar2;
      in_XMM6_Db = pfVar2[1];
      uVar4 = *(undefined8 *)(lVar10 + 0x34 + lVar16);
      in_XMM13_Da = *(float *)(lVar10 + lVar16);
      in_XMM2_Db = *(float *)(lVar10 + 4 + lVar16);
      in_XMM6_Dc = *(float *)(lVar10 + 8 + lVar16);
      in_XMM2_Da = *(float *)(lVar10 + 0xc + lVar16);
      in_XMM13_Db = (float)uVar4;
      in_XMM13_Dc = (float)((ulong)uVar4 >> 0x20);
      in_XMM4_Da = *(float *)(lVar10 + 0x18 + lVar16);
      uVar4 = *(undefined8 *)(lVar10 + 0x1c + lVar16);
      in_XMM4_Db = (float)uVar4;
      in_XMM4_Dc = (float)((ulong)uVar4 >> 0x20);
      fVar18 = *(float *)(lVar10 + 0x24 + lVar16);
      fVar47 = *(float *)(lVar10 + 0x28 + lVar16);
      fVar35 = *(float *)(lVar10 + 0x2c + lVar16);
      fVar40 = *(float *)(lVar10 + 0x30 + lVar16);
      fVar41 = fVar40 * fVar40 + fVar35 * fVar35 + fVar18 * fVar18 + fVar47 * fVar47;
      auVar21 = rsqrtss(ZEXT416((uint)fVar41),ZEXT416((uint)fVar41));
      fVar50 = auVar21._0_4_;
      fVar50 = fVar50 * fVar50 * fVar41 * -0.5 * fVar50 + fVar50 * 1.5;
      in_XMM4_Dd = fVar18 * fVar50;
      in_XMM13_Dd = fVar47 * fVar50;
      in_XMM2_Dd = fVar35 * fVar50;
      in_XMM6_Dd = fVar50 * fVar40;
      in_XMM2_Dc = *(float *)(lVar10 + 0x3c + lVar16);
    }
    else if (iVar6 == 0x9244) {
      lVar10 = *plVar9;
      lVar16 = uVar14 * plVar9[2];
      pfVar2 = (float *)(lVar10 + lVar16);
      in_XMM13_Da = *pfVar2;
      in_XMM13_Db = pfVar2[1];
      in_XMM13_Dc = pfVar2[2];
      in_XMM13_Dd = pfVar2[3];
      pfVar2 = (float *)(lVar10 + 0x10 + lVar16);
      in_XMM2_Da = *pfVar2;
      in_XMM2_Db = pfVar2[1];
      in_XMM2_Dc = pfVar2[2];
      in_XMM2_Dd = pfVar2[3];
      pfVar2 = (float *)(lVar10 + 0x20 + lVar16);
      in_XMM6_Da = *pfVar2;
      in_XMM6_Db = pfVar2[1];
      in_XMM6_Dc = pfVar2[2];
      in_XMM6_Dd = pfVar2[3];
      pfVar2 = (float *)(lVar10 + 0x30 + lVar16);
      in_XMM4_Da = *pfVar2;
      in_XMM4_Db = pfVar2[1];
      in_XMM4_Dc = pfVar2[2];
      in_XMM4_Dd = pfVar2[3];
    }
    fVar50 = in_XMM13_Dd * in_XMM2_Dd + in_XMM6_Dd * in_XMM4_Dd;
    fVar35 = in_XMM13_Dd * in_XMM2_Dd - in_XMM6_Dd * in_XMM4_Dd;
    fVar47 = in_XMM4_Dd * in_XMM4_Dd - in_XMM13_Dd * in_XMM13_Dd;
    fVar40 = in_XMM4_Dd * in_XMM4_Dd + in_XMM13_Dd * in_XMM13_Dd + -in_XMM2_Dd * in_XMM2_Dd +
             -in_XMM6_Dd * in_XMM6_Dd;
    fVar48 = in_XMM2_Dd * in_XMM2_Dd + fVar47 + -in_XMM6_Dd * in_XMM6_Dd;
    fVar28 = in_XMM13_Dd * in_XMM6_Dd - in_XMM2_Dd * in_XMM4_Dd;
    fVar44 = in_XMM2_Dd * in_XMM4_Dd + in_XMM13_Dd * in_XMM6_Dd;
    fVar52 = in_XMM2_Dd * in_XMM6_Dd + in_XMM13_Dd * in_XMM4_Dd;
    fVar18 = in_XMM2_Dd * in_XMM6_Dd - in_XMM13_Dd * in_XMM4_Dd;
    fVar50 = fVar50 + fVar50;
    fVar28 = fVar28 + fVar28;
    fVar47 = in_XMM6_Dd * in_XMM6_Dd + fVar47 + -in_XMM2_Dd * in_XMM2_Dd;
    fVar41 = fVar40 * 1.0 + fVar50 * 0.0 + fVar28 * 0.0;
    fVar27 = fVar40 * 0.0 + fVar50 * 1.0 + fVar28 * 0.0;
    fVar28 = fVar40 * 0.0 + fVar50 * 0.0 + fVar28 * 1.0;
    fVar52 = fVar52 + fVar52;
    fVar35 = fVar35 + fVar35;
    fVar40 = fVar35 * 1.0 + fVar48 * 0.0 + fVar52 * 0.0;
    fVar50 = fVar35 * 0.0 + fVar48 * 1.0 + fVar52 * 0.0;
    fVar35 = fVar35 * 0.0 + fVar48 * 0.0 + fVar52 * 1.0;
    fVar44 = fVar44 + fVar44;
    fVar18 = fVar18 + fVar18;
    fVar48 = fVar44 * 1.0 + fVar18 * 0.0 + fVar47 * 0.0;
    fVar52 = fVar44 * 0.0 + fVar18 * 1.0 + fVar47 * 0.0;
    fVar18 = fVar44 * 0.0 + fVar18 * 0.0 + fVar47 * 1.0;
    in_XMM14_Da = in_XMM13_Da * fVar41 + fVar40 * 0.0 + fVar48 * 0.0;
    in_XMM14_Db = in_XMM13_Da * fVar27 + fVar50 * 0.0 + fVar52 * 0.0;
    in_XMM14_Dc = in_XMM13_Da * fVar28 + fVar35 * 0.0 + fVar18 * 0.0;
    a0.field_0._0_4_ = in_XMM2_Da * fVar41 + in_XMM2_Db * fVar40 + fVar48 * 0.0;
    a0.field_0._4_4_ = in_XMM2_Da * fVar27 + in_XMM2_Db * fVar50 + fVar52 * 0.0;
    a0.field_0._8_4_ = in_XMM2_Da * fVar28 + in_XMM2_Db * fVar35 + fVar18 * 0.0;
    auVar19._0_4_ = in_XMM6_Da * fVar41 + in_XMM6_Db * fVar40 + in_XMM6_Dc * fVar48;
    auVar19._4_4_ = in_XMM6_Da * fVar27 + in_XMM6_Db * fVar50 + in_XMM6_Dc * fVar52;
    auVar19._8_4_ = in_XMM6_Da * fVar28 + in_XMM6_Db * fVar35 + in_XMM6_Dc * fVar18;
    auVar33._0_4_ = in_XMM4_Da * fVar41 + in_XMM4_Db * fVar40 + in_XMM4_Dc * fVar48;
    auVar33._4_4_ = in_XMM4_Da * fVar27 + in_XMM4_Db * fVar50 + in_XMM4_Dc * fVar52;
    auVar33._8_4_ = in_XMM4_Da * fVar28 + in_XMM4_Db * fVar35 + in_XMM4_Dc * fVar18;
    fVar18 = in_XMM13_Db;
    fVar40 = in_XMM13_Dc;
  }
  else {
    local_168._0_4_ = pGVar7->fnumTimeSegments;
    fVar18 = (pGVar7->time_range).lower;
    auVar29._4_8_ = 0;
    auVar29._0_4_ = fVar18;
    fVar47 = (((ray->dir).field_0.m128[3] - fVar18) / ((pGVar7->time_range).upper - fVar18)) *
             (float)local_168._0_4_;
    fVar18 = floorf(fVar47);
    if ((float)local_168._0_4_ + -1.0 <= fVar18) {
      fVar18 = (float)local_168._0_4_ + -1.0;
    }
    auVar22 = ZEXT812(0);
    if (0.0 <= fVar18) {
      auVar22._4_8_ = 0;
      auVar22._0_4_ = fVar18;
    }
    uVar13 = (uint)auVar22._0_4_;
    fVar47 = fVar47 - auVar22._0_4_;
    lVar10 = *(long *)&pGVar7[1].fnumTimeSegments;
    plVar9 = (long *)(lVar10 + (ulong)uVar13 * 0x38);
    iVar6 = *(int *)(lVar10 + 0x20 + (ulong)uVar13 * 0x38);
    if ((pGVar7->field_8).field_0x1 != '\x01') {
      if (iVar6 == 0x9134) {
        lVar16 = *plVar9;
        lVar15 = plVar9[2] * uVar14;
        in_XMM14_Db = *(float *)(lVar16 + 0x10 + lVar15);
        in_XMM14_Da = *(float *)(lVar16 + lVar15);
        fVar18 = *(float *)(lVar16 + 8 + lVar15);
        in_XMM13_Da = *(float *)(lVar16 + 0xc + lVar15);
        in_XMM14_Dc = *(float *)(lVar16 + 0x20 + lVar15);
        auVar22._4_4_ = *(undefined4 *)(lVar16 + 0x14 + lVar15);
        auVar22._0_4_ = *(undefined4 *)(lVar16 + 4 + lVar15);
        auVar22._8_4_ = *(undefined4 *)(lVar16 + 0x24 + lVar15);
        fVar40 = *(float *)(lVar16 + 0x18 + lVar15);
        fVar35 = *(float *)(lVar16 + 0x28 + lVar15);
        in_XMM13_Db = *(float *)(lVar16 + 0x1c + lVar15);
        in_XMM13_Dc = *(float *)(lVar16 + 0x2c + lVar15);
        auVar29._4_8_ = 0;
        auVar29._0_4_ = in_XMM13_Dc;
      }
      else if (iVar6 == 0x9234) {
        lVar16 = *plVar9;
        lVar15 = plVar9[2] * uVar14;
        uVar4 = *(undefined8 *)(lVar16 + 4 + lVar15);
        in_XMM14_Da = *(float *)(lVar16 + lVar15);
        in_XMM14_Db = (float)uVar4;
        in_XMM14_Dc = (float)((ulong)uVar4 >> 0x20);
        uVar4 = *(undefined8 *)(lVar16 + 0x10 + lVar15);
        auVar22._4_4_ = (int)uVar4;
        auVar22._0_4_ = *(undefined4 *)(lVar16 + 0xc + lVar15);
        auVar22._8_4_ = (int)((ulong)uVar4 >> 0x20);
        uVar4 = *(undefined8 *)(lVar16 + 0x1c + lVar15);
        fVar18 = *(float *)(lVar16 + 0x18 + lVar15);
        fVar40 = (float)uVar4;
        fVar35 = (float)((ulong)uVar4 >> 0x20);
        uVar3 = *(ulong *)(lVar16 + 0x28 + lVar15);
        auVar29._8_4_ = 0;
        auVar29._0_8_ = uVar3;
        in_XMM13_Da = *(float *)(lVar16 + 0x24 + lVar15);
        in_XMM13_Db = (float)uVar3;
        in_XMM13_Dc = (float)(uVar3 >> 0x20);
      }
      else if (iVar6 == 0xb001) {
        lVar16 = *plVar9;
        lVar15 = plVar9[2] * uVar14;
        pfVar2 = (float *)(lVar16 + 0x10 + lVar15);
        fVar18 = *pfVar2;
        fVar40 = pfVar2[1];
        uVar4 = *(undefined8 *)(lVar16 + 0x34 + lVar15);
        in_XMM14_Da = *(float *)(lVar16 + lVar15);
        fVar35 = *(float *)(lVar16 + 8 + lVar15);
        in_XMM6_Db = 0.0;
        in_XMM6_Dc = 0.0;
        auVar24._4_4_ = *(undefined4 *)(lVar16 + 4 + lVar15);
        auVar24._0_4_ = *(undefined4 *)(lVar16 + 0xc + lVar15);
        in_XMM13_Da = *(float *)(lVar16 + 0x18 + lVar15);
        uVar5 = *(undefined8 *)(lVar16 + 0x1c + lVar15);
        in_XMM4_Da = (float)uVar5;
        in_XMM4_Db = (float)((ulong)uVar5 >> 0x20);
        in_XMM4_Dc = 0.0;
        fVar50 = *(float *)(lVar16 + 0x24 + lVar15);
        fVar41 = *(float *)(lVar16 + 0x28 + lVar15);
        fVar27 = *(float *)(lVar16 + 0x2c + lVar15);
        fVar28 = *(float *)(lVar16 + 0x30 + lVar15);
        fVar41 = fVar28 * fVar28 + fVar27 * fVar27 + fVar50 * fVar50 + fVar41 * fVar41;
        auVar21 = rsqrtss(ZEXT416((uint)fVar41),ZEXT416((uint)fVar41));
        fVar50 = auVar21._0_4_;
        auVar37._0_4_ = fVar27 * (fVar50 * fVar50 * fVar41 * -0.5 * fVar50 + fVar50 * 1.5);
        auVar37._4_8_ = 0;
        in_XMM14_Db = (float)uVar4;
        in_XMM14_Dc = (float)((ulong)uVar4 >> 0x20);
        auVar29._0_8_ = CONCAT44(auVar37._0_4_,*(undefined4 *)(lVar16 + 0x3c + lVar15));
        auVar29._8_4_ = 0;
        auVar24._8_8_ = auVar29._0_8_;
        auVar22 = auVar24._0_12_;
        in_XMM13_Db = in_XMM4_Da;
        in_XMM13_Dc = in_XMM4_Db;
        in_XMM6_Da = fVar35;
      }
      else {
        fVar40 = extraout_XMM0_Db;
        fVar35 = extraout_XMM0_Dc;
        if (iVar6 == 0x9244) {
          lVar16 = *plVar9;
          lVar15 = plVar9[2] * uVar14;
          pfVar2 = (float *)(lVar16 + lVar15);
          in_XMM14_Da = *pfVar2;
          in_XMM14_Db = pfVar2[1];
          in_XMM14_Dc = pfVar2[2];
          auVar22 = SUB1612(*(undefined1 (*) [16])(lVar16 + 0x10 + lVar15),0);
          pfVar2 = (float *)(lVar16 + 0x20 + lVar15);
          fVar18 = *pfVar2;
          fVar40 = pfVar2[1];
          fVar35 = pfVar2[2];
          pfVar2 = (float *)(lVar16 + 0x30 + lVar15);
          in_XMM13_Da = *pfVar2;
          in_XMM13_Db = pfVar2[1];
          in_XMM13_Dc = pfVar2[2];
        }
      }
      lVar16 = (ulong)(uVar13 + 1) * 0x38;
      plVar9 = (long *)(lVar10 + lVar16);
      iVar6 = *(int *)(lVar10 + 0x20 + lVar16);
      if (iVar6 == 0x9134) {
        lVar10 = *plVar9;
        lVar16 = uVar14 * plVar9[2];
        auVar29._4_4_ = *(undefined4 *)(lVar10 + 0x10 + lVar16);
        auVar29._0_4_ = *(undefined4 *)(lVar10 + lVar16);
        in_XMM6_Da = *(float *)(lVar10 + 4 + lVar16);
        in_XMM4_Da = *(float *)(lVar10 + 8 + lVar16);
        auVar29._8_4_ = *(undefined4 *)(lVar10 + 0x20 + lVar16);
        in_XMM6_Db = *(float *)(lVar10 + 0x14 + lVar16);
        in_XMM6_Dc = *(float *)(lVar10 + 0x24 + lVar16);
        in_XMM4_Db = *(float *)(lVar10 + 0x18 + lVar16);
        in_XMM4_Dc = *(float *)(lVar10 + 0x28 + lVar16);
        auVar37._4_4_ = *(undefined4 *)(lVar10 + 0x1c + lVar16);
        auVar37._0_4_ = (float)*(undefined4 *)(lVar10 + 0xc + lVar16);
        auVar37._8_4_ = *(undefined4 *)(lVar10 + 0x2c + lVar16);
      }
      else if (iVar6 == 0x9234) {
        lVar10 = *plVar9;
        lVar16 = uVar14 * plVar9[2];
        uVar4 = *(undefined8 *)(lVar10 + 4 + lVar16);
        auVar29._4_4_ = (int)uVar4;
        auVar29._0_4_ = *(undefined4 *)(lVar10 + lVar16);
        auVar29._8_4_ = (int)((ulong)uVar4 >> 0x20);
        uVar4 = *(undefined8 *)(lVar10 + 0x10 + lVar16);
        in_XMM6_Da = *(float *)(lVar10 + 0xc + lVar16);
        in_XMM6_Db = (float)uVar4;
        in_XMM6_Dc = (float)((ulong)uVar4 >> 0x20);
        uVar4 = *(undefined8 *)(lVar10 + 0x1c + lVar16);
        in_XMM4_Da = *(float *)(lVar10 + 0x18 + lVar16);
        in_XMM4_Db = (float)uVar4;
        in_XMM4_Dc = (float)((ulong)uVar4 >> 0x20);
        uVar4 = *(undefined8 *)(lVar10 + 0x28 + lVar16);
        auVar37._4_4_ = (int)uVar4;
        auVar37._0_4_ = (float)*(undefined4 *)(lVar10 + 0x24 + lVar16);
        auVar37._8_4_ = (int)((ulong)uVar4 >> 0x20);
      }
      else if (iVar6 == 0xb001) {
        lVar10 = *plVar9;
        lVar16 = uVar14 * plVar9[2];
        uVar4 = *(undefined8 *)(lVar10 + 0x10 + lVar16);
        in_XMM4_Da = (float)uVar4;
        in_XMM4_Db = (float)((ulong)uVar4 >> 0x20);
        uVar4 = *(undefined8 *)(lVar10 + 0x34 + lVar16);
        in_XMM6_Db = *(float *)(lVar10 + 4 + lVar16);
        in_XMM4_Dc = *(float *)(lVar10 + 8 + lVar16);
        in_XMM6_Da = *(float *)(lVar10 + 0xc + lVar16);
        uVar5 = *(undefined8 *)(lVar10 + 0x1c + lVar16);
        fVar50 = *(float *)(lVar10 + 0x24 + lVar16);
        fVar41 = *(float *)(lVar10 + 0x28 + lVar16);
        fVar27 = *(float *)(lVar10 + 0x2c + lVar16);
        fVar28 = *(float *)(lVar10 + 0x30 + lVar16);
        fVar50 = fVar28 * fVar28 + fVar27 * fVar27 + fVar50 * fVar50 + fVar41 * fVar41;
        rsqrtss(ZEXT416((uint)fVar50),ZEXT416((uint)fVar50));
        uStack_114 = (undefined4)((ulong)uVar4 >> 0x20);
        auVar29._4_4_ = (int)uVar4;
        auVar29._0_4_ = *(undefined4 *)(lVar10 + lVar16);
        auVar29._8_4_ = uStack_114;
        in_XMM6_Dc = *(float *)(lVar10 + 0x3c + lVar16);
        auVar37._4_4_ = (int)uVar5;
        auVar37._0_4_ = (float)*(undefined4 *)(lVar10 + 0x18 + lVar16);
        auVar37._8_4_ = (int)((ulong)uVar5 >> 0x20);
      }
      else if (iVar6 == 0x9244) {
        lVar10 = *plVar9;
        lVar16 = uVar14 * plVar9[2];
        auVar29 = SUB1612(*(undefined1 (*) [16])(lVar10 + lVar16),0);
        pfVar2 = (float *)(lVar10 + 0x10 + lVar16);
        in_XMM6_Da = *pfVar2;
        in_XMM6_Db = pfVar2[1];
        in_XMM6_Dc = pfVar2[2];
        pfVar2 = (float *)(lVar10 + 0x20 + lVar16);
        in_XMM4_Da = *pfVar2;
        in_XMM4_Db = pfVar2[1];
        in_XMM4_Dc = pfVar2[2];
        auVar37 = SUB1612(*(undefined1 (*) [16])(lVar10 + 0x30 + lVar16),0);
      }
      fVar50 = 1.0 - fVar47;
      in_XMM14_Da = in_XMM14_Da * fVar50 + auVar29._0_4_ * fVar47;
      in_XMM14_Db = in_XMM14_Db * fVar50 + auVar29._4_4_ * fVar47;
      in_XMM14_Dc = in_XMM14_Dc * fVar50 + auVar29._8_4_ * fVar47;
      a0.field_0._0_4_ = auVar22._0_4_ * fVar50 + in_XMM6_Da * fVar47;
      a0.field_0._4_4_ = auVar22._4_4_ * fVar50 + in_XMM6_Db * fVar47;
      a0.field_0._8_4_ = auVar22._8_4_ * fVar50 + in_XMM6_Dc * fVar47;
      auVar19._0_4_ = fVar18 * fVar50 + in_XMM4_Da * fVar47;
      auVar19._4_4_ = fVar40 * fVar50 + in_XMM4_Db * fVar47;
      auVar19._8_4_ = fVar35 * fVar50 + in_XMM4_Dc * fVar47;
      auVar32._0_4_ = fVar50 * in_XMM13_Da + fVar47 * auVar37._0_4_;
      auVar32._4_4_ = fVar50 * in_XMM13_Db + fVar47 * auVar37._4_4_;
      auVar32._8_4_ = fVar50 * in_XMM13_Dc + fVar47 * auVar37._8_4_;
      goto LAB_0018075e;
    }
    if (iVar6 == 0x9134) {
      lVar16 = *plVar9;
      lVar15 = plVar9[2] * uVar14;
      local_168._4_4_ = *(undefined4 *)(lVar16 + 0x10 + lVar15);
      local_168._0_4_ = *(undefined4 *)(lVar16 + lVar15);
      uStack_160._0_4_ = (float)*(undefined4 *)(lVar16 + 0x20 + lVar15);
      uStack_160._4_4_ = 0.0;
      local_148._4_4_ = *(undefined4 *)(lVar16 + 0x14 + lVar15);
      local_148._0_4_ = *(undefined4 *)(lVar16 + 4 + lVar15);
      fStack_140 = (float)*(undefined4 *)(lVar16 + 0x24 + lVar15);
      fStack_13c = 0.0;
      local_108._4_4_ = *(undefined4 *)(lVar16 + 0x18 + lVar15);
      local_108._0_4_ = *(undefined4 *)(lVar16 + 8 + lVar15);
      fStack_100 = (float)*(undefined4 *)(lVar16 + 0x28 + lVar15);
      fStack_fc = 0.0;
      local_128._4_4_ = *(undefined4 *)(lVar16 + 0x1c + lVar15);
      local_128._0_4_ = *(undefined4 *)(lVar16 + 0xc + lVar15);
      fStack_120 = (float)*(undefined4 *)(lVar16 + 0x2c + lVar15);
      fStack_11c = 0.0;
    }
    else if (iVar6 == 0x9234) {
      lVar16 = *plVar9;
      lVar15 = plVar9[2] * uVar14;
      uVar4 = *(undefined8 *)(lVar16 + 4 + lVar15);
      local_168._4_4_ = (int)uVar4;
      local_168._0_4_ = *(undefined4 *)(lVar16 + lVar15);
      uStack_160._0_4_ = (float)(int)((ulong)uVar4 >> 0x20);
      uStack_160._4_4_ = 0.0;
      uVar4 = *(undefined8 *)(lVar16 + 0x10 + lVar15);
      local_148._4_4_ = (int)uVar4;
      local_148._0_4_ = *(undefined4 *)(lVar16 + 0xc + lVar15);
      fStack_140 = (float)(int)((ulong)uVar4 >> 0x20);
      fStack_13c = 0.0;
      uVar4 = *(undefined8 *)(lVar16 + 0x1c + lVar15);
      local_108._4_4_ = (int)uVar4;
      local_108._0_4_ = *(undefined4 *)(lVar16 + 0x18 + lVar15);
      fStack_100 = (float)(int)((ulong)uVar4 >> 0x20);
      fStack_fc = 0.0;
      uVar4 = *(undefined8 *)(lVar16 + 0x28 + lVar15);
      local_128._4_4_ = (int)uVar4;
      local_128._0_4_ = *(undefined4 *)(lVar16 + 0x24 + lVar15);
      fStack_120 = (float)(int)((ulong)uVar4 >> 0x20);
      fStack_11c = 0.0;
    }
    else if (iVar6 == 0xb001) {
      lVar16 = *plVar9;
      lVar15 = plVar9[2] * uVar14;
      pfVar2 = (float *)(lVar16 + 0x10 + lVar15);
      in_XMM12_Da = *pfVar2;
      in_XMM12_Db = pfVar2[1];
      uVar4 = *(undefined8 *)(lVar16 + 0x34 + lVar15);
      in_XMM10_Da = *(float *)(lVar16 + lVar15);
      in_XMM11_Db = *(float *)(lVar16 + 4 + lVar15);
      in_XMM12_Dc = *(float *)(lVar16 + 8 + lVar15);
      in_XMM11_Da = *(float *)(lVar16 + 0xc + lVar15);
      in_XMM13_Da = *(float *)(lVar16 + 0x18 + lVar15);
      uVar5 = *(undefined8 *)(lVar16 + 0x1c + lVar15);
      in_XMM13_Db = (float)uVar5;
      in_XMM13_Dc = (float)((ulong)uVar5 >> 0x20);
      fVar18 = *(float *)(lVar16 + 0x24 + lVar15);
      in_XMM10_Dd = *(float *)(lVar16 + 0x28 + lVar15);
      in_XMM11_Dd = *(float *)(lVar16 + 0x2c + lVar15);
      fVar35 = *(float *)(lVar16 + 0x30 + lVar15);
      fVar50 = fVar35 * fVar35 +
               in_XMM11_Dd * in_XMM11_Dd + fVar18 * fVar18 + in_XMM10_Dd * in_XMM10_Dd;
      auVar21 = rsqrtss(ZEXT416((uint)fVar50),ZEXT416((uint)fVar50));
      fVar40 = auVar21._0_4_;
      in_XMM12_Dd = fVar40 * fVar40 * fVar50 * -0.5 * fVar40 + fVar40 * 1.5;
      in_XMM13_Dd = fVar18 * in_XMM12_Dd;
      in_XMM10_Dd = in_XMM10_Dd * in_XMM12_Dd;
      in_XMM11_Dd = in_XMM11_Dd * in_XMM12_Dd;
      in_XMM12_Dd = in_XMM12_Dd * fVar35;
      fStack_100 = in_XMM12_Dc;
      local_108 = (undefined1  [8])*(undefined8 *)pfVar2;
      fStack_fc = in_XMM12_Dd;
      in_XMM10_Db = (float)uVar4;
      in_XMM10_Dc = (float)((ulong)uVar4 >> 0x20);
      local_168._4_4_ = in_XMM10_Db;
      local_168._0_4_ = in_XMM10_Da;
      uStack_160._0_4_ = in_XMM10_Dc;
      uStack_160._4_4_ = in_XMM10_Dd;
      in_XMM11_Dc = *(float *)(lVar16 + 0x3c + lVar15);
      local_148._4_4_ = in_XMM11_Db;
      local_148._0_4_ = in_XMM11_Da;
      fStack_140 = in_XMM11_Dc;
      fStack_13c = in_XMM11_Dd;
      local_128._4_4_ = in_XMM13_Db;
      local_128._0_4_ = in_XMM13_Da;
      fStack_120 = in_XMM13_Dc;
      fStack_11c = in_XMM13_Dd;
    }
    else if (iVar6 == 0x9244) {
      lVar16 = *plVar9;
      lVar15 = plVar9[2] * uVar14;
      _local_168 = *(undefined1 (*) [16])(lVar16 + lVar15);
      _local_148 = *(undefined1 (*) [16])(lVar16 + 0x10 + lVar15);
      _local_108 = *(undefined1 (*) [16])(lVar16 + 0x20 + lVar15);
      _local_128 = *(undefined1 (*) [16])(lVar16 + 0x30 + lVar15);
    }
    lVar16 = (ulong)(uVar13 + 1) * 0x38;
    plVar9 = (long *)(lVar10 + lVar16);
    iVar6 = *(int *)(lVar10 + 0x20 + lVar16);
    if (iVar6 == 0x9134) {
      lVar10 = *plVar9;
      lVar16 = uVar14 * plVar9[2];
      in_XMM10_Db = *(float *)(lVar10 + 0x10 + lVar16);
      in_XMM10_Da = *(float *)(lVar10 + lVar16);
      in_XMM12_Da = *(float *)(lVar10 + 4 + lVar16);
      in_XMM11_Da = *(float *)(lVar10 + 8 + lVar16);
      in_XMM13_Da = *(float *)(lVar10 + 0xc + lVar16);
      in_XMM10_Dc = *(float *)(lVar10 + 0x20 + lVar16);
      in_XMM10_Dd = 0.0;
      in_XMM12_Db = *(float *)(lVar10 + 0x14 + lVar16);
      in_XMM12_Dc = *(float *)(lVar10 + 0x24 + lVar16);
      in_XMM12_Dd = 0.0;
      in_XMM11_Db = *(float *)(lVar10 + 0x18 + lVar16);
      in_XMM11_Dc = *(float *)(lVar10 + 0x28 + lVar16);
      in_XMM11_Dd = 0.0;
      in_XMM13_Db = *(float *)(lVar10 + 0x1c + lVar16);
      in_XMM13_Dc = *(float *)(lVar10 + 0x2c + lVar16);
      in_XMM13_Dd = 0.0;
    }
    else if (iVar6 == 0x9234) {
      lVar10 = *plVar9;
      lVar16 = uVar14 * plVar9[2];
      uVar4 = *(undefined8 *)(lVar10 + 4 + lVar16);
      in_XMM10_Da = *(float *)(lVar10 + lVar16);
      in_XMM10_Db = (float)uVar4;
      in_XMM10_Dc = (float)((ulong)uVar4 >> 0x20);
      in_XMM10_Dd = 0.0;
      uVar4 = *(undefined8 *)(lVar10 + 0x10 + lVar16);
      in_XMM12_Da = *(float *)(lVar10 + 0xc + lVar16);
      in_XMM12_Db = (float)uVar4;
      in_XMM12_Dc = (float)((ulong)uVar4 >> 0x20);
      in_XMM12_Dd = 0.0;
      uVar4 = *(undefined8 *)(lVar10 + 0x1c + lVar16);
      in_XMM11_Da = *(float *)(lVar10 + 0x18 + lVar16);
      in_XMM11_Db = (float)uVar4;
      in_XMM11_Dc = (float)((ulong)uVar4 >> 0x20);
      in_XMM11_Dd = 0.0;
      uVar4 = *(undefined8 *)(lVar10 + 0x28 + lVar16);
      in_XMM13_Da = *(float *)(lVar10 + 0x24 + lVar16);
      in_XMM13_Db = (float)uVar4;
      in_XMM13_Dc = (float)((ulong)uVar4 >> 0x20);
      in_XMM13_Dd = 0.0;
    }
    else if (iVar6 == 0xb001) {
      lVar10 = *plVar9;
      lVar16 = uVar14 * plVar9[2];
      uVar4 = *(undefined8 *)(lVar10 + 0x10 + lVar16);
      in_XMM11_Da = (float)uVar4;
      in_XMM11_Db = (float)((ulong)uVar4 >> 0x20);
      uVar4 = *(undefined8 *)(lVar10 + 0x34 + lVar16);
      in_XMM10_Da = *(float *)(lVar10 + lVar16);
      in_XMM12_Db = *(float *)(lVar10 + 4 + lVar16);
      in_XMM11_Dc = *(float *)(lVar10 + 8 + lVar16);
      in_XMM12_Da = *(float *)(lVar10 + 0xc + lVar16);
      in_XMM13_Da = *(float *)(lVar10 + 0x18 + lVar16);
      uVar5 = *(undefined8 *)(lVar10 + 0x1c + lVar16);
      in_XMM13_Db = (float)uVar5;
      in_XMM13_Dc = (float)((ulong)uVar5 >> 0x20);
      fVar18 = *(float *)(lVar10 + 0x24 + lVar16);
      in_XMM10_Dd = *(float *)(lVar10 + 0x28 + lVar16);
      in_XMM12_Dd = *(float *)(lVar10 + 0x2c + lVar16);
      fVar35 = *(float *)(lVar10 + 0x30 + lVar16);
      fVar50 = fVar35 * fVar35 +
               in_XMM12_Dd * in_XMM12_Dd + fVar18 * fVar18 + in_XMM10_Dd * in_XMM10_Dd;
      auVar21 = rsqrtss(ZEXT416((uint)fVar50),ZEXT416((uint)fVar50));
      fVar40 = auVar21._0_4_;
      in_XMM11_Dd = fVar40 * fVar40 * fVar50 * -0.5 * fVar40 + fVar40 * 1.5;
      in_XMM13_Dd = fVar18 * in_XMM11_Dd;
      in_XMM10_Dd = in_XMM10_Dd * in_XMM11_Dd;
      in_XMM12_Dd = in_XMM12_Dd * in_XMM11_Dd;
      in_XMM11_Dd = in_XMM11_Dd * fVar35;
      in_XMM10_Db = (float)uVar4;
      in_XMM10_Dc = (float)((ulong)uVar4 >> 0x20);
      in_XMM12_Dc = *(float *)(lVar10 + 0x3c + lVar16);
    }
    else if (iVar6 == 0x9244) {
      lVar10 = *plVar9;
      lVar16 = uVar14 * plVar9[2];
      pfVar2 = (float *)(lVar10 + lVar16);
      in_XMM10_Da = *pfVar2;
      in_XMM10_Db = pfVar2[1];
      in_XMM10_Dc = pfVar2[2];
      in_XMM10_Dd = pfVar2[3];
      pfVar2 = (float *)(lVar10 + 0x10 + lVar16);
      in_XMM12_Da = *pfVar2;
      in_XMM12_Db = pfVar2[1];
      in_XMM12_Dc = pfVar2[2];
      in_XMM12_Dd = pfVar2[3];
      pfVar2 = (float *)(lVar10 + 0x20 + lVar16);
      in_XMM11_Da = *pfVar2;
      in_XMM11_Db = pfVar2[1];
      in_XMM11_Dc = pfVar2[2];
      in_XMM11_Dd = pfVar2[3];
      pfVar2 = (float *)(lVar10 + 0x30 + lVar16);
      in_XMM13_Da = *pfVar2;
      in_XMM13_Db = pfVar2[1];
      in_XMM13_Dc = pfVar2[2];
      in_XMM13_Dd = pfVar2[3];
    }
    fVar35 = fStack_fc * in_XMM11_Dd +
             fStack_13c * in_XMM12_Dd + in_XMM13_Dd * fStack_11c + uStack_160._4_4_ * in_XMM10_Dd;
    fVar18 = -fVar35;
    local_f8 = -in_XMM11_Dd;
    local_e8 = in_XMM12_Dd;
    if (fVar35 < fVar18) {
      local_e8 = -in_XMM12_Dd;
    }
    fVar50 = ABS(fVar35);
    fVar40 = fVar18;
    if (fVar18 <= fVar35) {
      fVar40 = fVar35;
    }
    fVar41 = 1.0 - fVar50;
    if (fVar41 < 0.0) {
      fVar41 = sqrtf(fVar41);
    }
    else {
      fVar41 = SQRT(fVar41);
    }
    local_118 = (float)(~-(uint)(fVar35 < fVar18) & (uint)in_XMM11_Dd |
                       (uint)local_f8 & -(uint)(fVar35 < fVar18));
    fVar41 = 1.5707964 -
             fVar41 * (((((fVar50 * -0.0043095737 + 0.0192803) * fVar50 + -0.04489909) * fVar50 +
                        0.08785567) * fVar50 + -0.21450998) * fVar50 + 1.5707952);
    fVar18 = 0.0;
    if (0.0 <= fVar41) {
      fVar18 = fVar41;
    }
    fVar50 = (float)(-(uint)(1.0 < fVar50) & 0x7fc00000 |
                    ~-(uint)(1.0 < fVar50) &
                    (uint)(1.5707964 -
                          (float)((uint)-fVar18 & -(uint)(fVar40 < 0.0) |
                                 ~-(uint)(fVar40 < 0.0) & (uint)fVar18))) * fVar47;
    fVar41 = floorf(fVar50 * 0.63661975);
    fVar50 = fVar50 - fVar41 * 1.5707964;
    fVar18 = fVar50 * fVar50;
    uVar13 = (int)fVar41 & 3;
    fVar27 = ((((fVar18 * -2.5963018e-07 + 2.4756235e-05) * fVar18 + -0.001388833) * fVar18 +
              0.04166664) * fVar18 + -0.5) * fVar18 + 1.0;
    fVar50 = (((((fVar18 * -2.5029328e-08 + 2.7600126e-06) * fVar18 + -0.00019842605) * fVar18 +
               0.008333348) * fVar18 + -0.16666667) * fVar18 + 1.0) * fVar50;
    fVar18 = fVar27;
    if (((int)fVar41 & 1U) != 0) {
      fVar18 = fVar50;
      fVar50 = fVar27;
    }
    if (uVar13 - 1 < 2) {
      fVar18 = -fVar18;
    }
    fVar27 = fVar40 * fStack_13c - local_e8;
    fVar41 = fVar40 * fStack_fc - local_118;
    if (uVar13 < 2) {
      fVar50 = -fVar50;
    }
    fVar28 = 1.0 - fVar47;
    fVar56 = fVar28 * fStack_13c + local_e8 * fVar47;
    fVar44 = fVar28 * fStack_fc + local_118 * fVar47;
    uVar13 = (int)((uint)(fVar35 < 0.0) << 0x1f) >> 0x1f;
    uVar38 = (int)((uint)(fVar35 < 0.0) << 0x1f) >> 0x1f;
    fVar39 = (float)((uint)-in_XMM13_Dd & uVar13 | ~uVar13 & (uint)in_XMM13_Dd);
    fVar45 = (float)((uint)-in_XMM10_Dd & uVar38 | ~uVar38 & (uint)in_XMM10_Dd);
    fVar35 = fVar40 * fStack_11c - fVar39;
    fVar48 = fVar40 * uStack_160._4_4_ - fVar45;
    auVar26._0_8_ = CONCAT44(fStack_fc,fVar41) ^ 0x8000000000000000;
    auVar26._8_4_ = -fStack_fc;
    auVar26._12_4_ = -fStack_fc;
    auVar31._4_12_ = auVar26._4_12_;
    auVar31._0_4_ = fVar41 * fVar41 + fVar27 * fVar27 + fVar35 * fVar35 + fVar48 * fVar48;
    auVar21._0_8_ = CONCAT44(fStack_fc,auVar31._0_4_) ^ 0x8000000000000000;
    auVar21._8_4_ = -fStack_fc;
    auVar21._12_4_ = -fStack_fc;
    auVar21 = rsqrtss(auVar21,auVar31);
    fVar52 = auVar21._0_4_;
    fVar42 = fVar52 * fVar52 * auVar31._0_4_ * -0.5 * fVar52 + fVar52 * 1.5;
    fVar52 = fStack_11c * fVar28 + fVar39 * fVar47;
    fVar39 = uStack_160._4_4_ * fVar28 + fVar45 * fVar47;
    fVar51 = fVar44 * fVar44 + fVar56 * fVar56 + fVar52 * fVar52 + fVar39 * fVar39;
    auVar21 = rsqrtss(ZEXT416((uint)fVar51),ZEXT416((uint)fVar51));
    fVar45 = auVar21._0_4_;
    fVar45 = fVar45 * fVar45 * fVar51 * -0.5 * fVar45 + fVar45 * 1.5;
    uVar13 = (int)((uint)(0.9995 < fVar40) << 0x1f) >> 0x1f;
    uVar38 = (int)((uint)(0.9995 < fVar40) << 0x1f) >> 0x1f;
    fVar35 = (float)(~uVar13 & (uint)(fVar18 * fStack_11c + fVar50 * fVar42 * fVar35) |
                    (uint)(fVar45 * fVar52) & uVar13);
    fVar48 = (float)(~uVar38 & (uint)(fVar18 * uStack_160._4_4_ + fVar50 * fVar42 * fVar48) |
                    (uint)(fVar45 * fVar39) & uVar38);
    if (0.9995 < fVar40) {
      fVar56 = fVar56 * fVar45;
      fVar44 = fVar44 * fVar45;
    }
    else {
      fVar56 = fStack_13c * fVar18 + fVar27 * fVar42 * fVar50;
      fVar44 = fStack_fc * fVar18 + fVar41 * fVar42 * fVar50;
    }
    fVar54 = (float)local_168._0_4_ * fVar28 + in_XMM10_Da * fVar47;
    fVar18 = (float)local_168._4_4_ * fVar28 + in_XMM10_Db * fVar47;
    fVar40 = (float)uStack_160 * fVar28 + in_XMM10_Dc * fVar47;
    fVar50 = (float)local_148._0_4_ * fVar28 + in_XMM12_Da * fVar47;
    fVar41 = (float)local_148._4_4_ * fVar28 + in_XMM12_Db * fVar47;
    in_XMM2_Dc = fStack_140 * fVar28 + in_XMM12_Dc * fVar47;
    fVar39 = (float)local_108._0_4_ * fVar28 + in_XMM11_Da * fVar47;
    fVar42 = (float)local_108._4_4_ * fVar28 + in_XMM11_Db * fVar47;
    fVar45 = fStack_100 * fVar28 + in_XMM11_Dc * fVar47;
    fVar27 = (float)local_128._0_4_ * fVar28 + in_XMM13_Da * fVar47;
    fVar52 = (float)local_128._4_4_ * fVar28 + in_XMM13_Db * fVar47;
    fVar28 = fStack_120 * fVar28 + in_XMM13_Dc * fVar47;
    fVar43 = fVar48 * fVar56 + fVar35 * fVar44;
    fVar34 = fVar48 * fVar56 - fVar35 * fVar44;
    fVar51 = fVar35 * fVar35 + fVar48 * fVar48 + -fVar56 * fVar56 + -fVar44 * fVar44;
    fVar47 = fVar35 * fVar35 - fVar48 * fVar48;
    fVar46 = fVar56 * fVar56 + fVar47 + -fVar44 * fVar44;
    fVar53 = fVar48 * fVar44 - fVar35 * fVar56;
    fVar36 = fVar35 * fVar56 + fVar48 * fVar44;
    fVar49 = fVar56 * fVar44 + fVar35 * fVar48;
    fVar57 = fVar56 * fVar44 - fVar35 * fVar48;
    fVar43 = fVar43 + fVar43;
    fVar53 = fVar53 + fVar53;
    fVar47 = fVar44 * fVar44 + fVar47 + -fVar56 * fVar56;
    fVar35 = fVar51 * 1.0 + fVar43 * 0.0 + fVar53 * 0.0;
    fVar44 = fVar51 * 0.0 + fVar43 * 1.0 + fVar53 * 0.0;
    fVar48 = fVar51 * 0.0 + fVar43 * 0.0 + fVar53 * 1.0;
    fVar49 = fVar49 + fVar49;
    fVar34 = fVar34 + fVar34;
    fVar51 = fVar34 * 1.0 + fVar46 * 0.0 + fVar49 * 0.0;
    fVar56 = fVar34 * 0.0 + fVar46 * 1.0 + fVar49 * 0.0;
    fVar34 = fVar34 * 0.0 + fVar46 * 0.0 + fVar49 * 1.0;
    fVar36 = fVar36 + fVar36;
    fVar57 = fVar57 + fVar57;
    fVar43 = fVar36 * 1.0 + fVar57 * 0.0 + fVar47 * 0.0;
    fVar46 = fVar36 * 0.0 + fVar57 * 1.0 + fVar47 * 0.0;
    fVar47 = fVar36 * 0.0 + fVar57 * 0.0 + fVar47 * 1.0;
    in_XMM14_Da = fVar54 * fVar35 + fVar51 * 0.0 + fVar43 * 0.0;
    in_XMM14_Db = fVar54 * fVar44 + fVar56 * 0.0 + fVar46 * 0.0;
    in_XMM14_Dc = fVar54 * fVar48 + fVar34 * 0.0 + fVar47 * 0.0;
    a0.field_0._0_4_ = fVar50 * fVar35 + fVar41 * fVar51 + fVar43 * 0.0;
    a0.field_0._4_4_ = fVar50 * fVar44 + fVar41 * fVar56 + fVar46 * 0.0;
    a0.field_0._8_4_ = fVar50 * fVar48 + fVar41 * fVar34 + fVar47 * 0.0;
    auVar19._0_4_ = fVar39 * fVar35 + fVar42 * fVar51 + fVar45 * fVar43;
    auVar19._4_4_ = fVar39 * fVar44 + fVar42 * fVar56 + fVar45 * fVar46;
    auVar19._8_4_ = fVar39 * fVar48 + fVar42 * fVar34 + fVar45 * fVar47;
    auVar33._0_4_ = fVar27 * fVar35 + fVar52 * fVar51 + fVar28 * fVar43;
    auVar33._4_4_ = fVar27 * fVar44 + fVar52 * fVar56 + fVar28 * fVar46;
    auVar33._8_4_ = fVar27 * fVar48 + fVar52 * fVar34 + fVar28 * fVar47;
  }
  auVar32._0_4_ = auVar33._0_4_ + fVar18 + 0.0;
  auVar32._4_4_ = auVar33._4_4_ + fVar40 + 0.0;
  auVar32._8_4_ = auVar33._8_4_ + in_XMM2_Dc + 0.0;
LAB_0018075e:
  fVar18 = auVar19._0_4_;
  fVar47 = auVar19._4_4_;
  fVar35 = auVar19._8_4_;
  fVar40 = a0.field_0._0_4_;
  fVar50 = a0.field_0._4_4_;
  fVar41 = a0.field_0._8_4_;
  auVar25._0_4_ = fVar40 * fVar47 - fVar50 * fVar18;
  fVar27 = fVar50 * fVar35 - fVar41 * fVar47;
  fVar28 = fVar41 * fVar18 - fVar40 * fVar35;
  auVar20._4_4_ = fVar47 * in_XMM14_Dc - fVar35 * in_XMM14_Db;
  auVar25._4_4_ = fVar18 * in_XMM14_Db - fVar47 * in_XMM14_Da;
  auVar25._8_4_ = in_XMM14_Da * fVar50 - in_XMM14_Db * fVar40;
  auVar25._12_4_ = 0;
  auVar20._0_4_ = fVar27;
  auVar20._8_4_ = in_XMM14_Db * fVar41 - in_XMM14_Dc * fVar50;
  auVar20._12_4_ = 0;
  auVar30._4_4_ = fVar35 * in_XMM14_Da - fVar18 * in_XMM14_Dc;
  auVar30._0_4_ = fVar28;
  auVar30._8_4_ = in_XMM14_Dc * fVar40 - in_XMM14_Da * fVar41;
  auVar30._12_4_ = 0;
  auVar55._0_4_ = in_XMM14_Dc * auVar25._0_4_ + in_XMM14_Db * fVar28 + in_XMM14_Da * fVar27;
  auVar55._4_4_ = auVar55._0_4_;
  auVar55._8_4_ = auVar55._0_4_;
  auVar55._12_4_ = auVar55._0_4_;
  auVar21 = divps(auVar20,auVar55);
  auVar31 = divps(auVar30,auVar55);
  auVar26 = divps(auVar25,auVar55);
  fVar36 = auVar32._0_4_;
  fVar43 = auVar32._4_4_;
  fVar46 = auVar32._8_4_;
  fVar39 = auVar26._0_4_;
  fVar42 = auVar26._4_4_;
  fVar45 = auVar26._8_4_;
  fVar51 = auVar31._0_4_;
  fVar56 = auVar31._4_4_;
  fVar34 = auVar31._8_4_;
  fVar44 = auVar21._0_4_;
  fVar48 = auVar21._4_4_;
  fVar52 = auVar21._8_4_;
  fVar18 = (ray->org).field_0.m128[0];
  fVar47 = (ray->org).field_0.m128[1];
  fVar35 = (ray->org).field_0.m128[2];
  auVar19 = *(undefined1 (*) [12])&(ray->org).field_0;
  fVar40 = (ray->org).field_0.m128[3];
  aVar11 = (ray->org).field_0;
  pVVar1 = &ray->dir;
  fVar50 = (pVVar1->field_0).m128[0];
  fVar41 = (ray->dir).field_0.m128[1];
  fVar27 = (ray->dir).field_0.m128[2];
  auVar32 = *(undefined1 (*) [12])&pVVar1->field_0;
  fVar28 = (ray->dir).field_0.m128[3];
  aVar12 = pVVar1->field_0;
  (ray->org).field_0.m128[0] =
       fVar18 * fVar44 +
       fVar47 * fVar51 + (fVar35 * fVar39 - (fVar36 * fVar44 + fVar43 * fVar51 + fVar46 * fVar39));
  (ray->org).field_0.m128[1] =
       fVar18 * fVar48 +
       fVar47 * fVar56 + (fVar35 * fVar42 - (fVar36 * fVar48 + fVar43 * fVar56 + fVar46 * fVar42));
  (ray->org).field_0.m128[2] =
       fVar18 * fVar52 +
       fVar47 * fVar34 + (fVar35 * fVar45 - (fVar36 * fVar52 + fVar43 * fVar34 + fVar46 * fVar45));
  (ray->org).field_0.m128[3] = fVar40;
  (ray->dir).field_0.m128[0] = fVar50 * fVar44 + fVar41 * fVar51 + fVar27 * fVar39;
  (ray->dir).field_0.m128[1] = fVar50 * fVar48 + fVar41 * fVar56 + fVar27 * fVar42;
  (ray->dir).field_0.m128[2] = fVar50 * fVar52 + fVar41 * fVar34 + fVar27 * fVar45;
  (ray->dir).field_0.m128[3] = fVar28;
  (**(code **)(p_Var17 + 0x80))(p_Var17 + 0x58,ray);
  local_158 = auVar19._0_8_;
  uStack_150 = aVar11._8_8_;
  *(undefined8 *)&(ray->org).field_0 = local_158;
  *(undefined8 *)((long)&(ray->org).field_0 + 8) = uStack_150;
  local_168 = auVar32._0_8_;
  uStack_160 = aVar12._8_8_;
  *(undefined1 (*) [8])&(ray->dir).field_0 = local_168;
  *(undefined8 *)((long)&(ray->dir).field_0 + 8) = uStack_160;
  fVar47 = ray->tfar;
  fVar18 = ray->tfar;
  pRVar8->instID[0] = 0xffffffff;
  pRVar8->instPrimID[0] = 0xffffffff;
  return fVar18 <= 0.0 && fVar47 != 0.0;
}

Assistant:

bool InstanceArrayIntersector1MB::occluded(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
    {
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return false;

      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      if ((ray.mask & instance->mask) == 0) 
        return false;
#endif
      
      RTCRayQueryContext* user_context = context->user;
      bool occluded = false;
      if (likely(instance_id_stack::push(user_context, prim.instID_, prim.primID_)))
      {
        const AffineSpace3fa world2local = instance->getWorld2Local(prim.primID_, ray.time());
        const Vec3ff ray_org = ray.org;
        const Vec3ff ray_dir = ray.dir;
        ray.org = Vec3ff(xfmPoint(world2local, ray_org), ray.tnear());
        ray.dir = Vec3ff(xfmVector(world2local, ray_dir), ray.time());
        RayQueryContext newcontext((Scene*)object, user_context, context->args);
        object->intersectors.occluded((RTCRay&)ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        occluded = ray.tfar < 0.0f;
        instance_id_stack::pop(user_context);      
      }
      return occluded;
    }